

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

VkImageViewType vkt::synchronization::anon_unknown_0::getImageViewType(VkImageType imageType)

{
  undefined4 local_c;
  VkImageType imageType_local;
  
  if (imageType == VK_IMAGE_TYPE_1D) {
    local_c = VK_IMAGE_VIEW_TYPE_1D;
  }
  else if (imageType == VK_IMAGE_TYPE_2D) {
    local_c = VK_IMAGE_VIEW_TYPE_2D;
  }
  else if (imageType == VK_IMAGE_TYPE_3D) {
    local_c = VK_IMAGE_VIEW_TYPE_3D;
  }
  else {
    local_c = VK_IMAGE_VIEW_TYPE_LAST;
  }
  return local_c;
}

Assistant:

VkImageViewType getImageViewType (const VkImageType imageType)
{
	switch (imageType)
	{
		case VK_IMAGE_TYPE_1D:		return VK_IMAGE_VIEW_TYPE_1D;
		case VK_IMAGE_TYPE_2D:		return VK_IMAGE_VIEW_TYPE_2D;
		case VK_IMAGE_TYPE_3D:		return VK_IMAGE_VIEW_TYPE_3D;

		default:
			DE_ASSERT(0);
			return VK_IMAGE_VIEW_TYPE_LAST;
	}
}